

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,4ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,4ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ostream *poVar1;
  char **txt;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  ostringstream os;
  string sStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  to_string_abi_cxx11_(&sStack_1c8,(lest *)this,txt);
  poVar1 = std::operator<<((ostream *)local_188,(string *)&sStack_1c8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  make_tuple_string<std::tuple<char,int,double,char_const*>,3ul>::make_abi_cxx11_
            (&sStack_1c8,(make_tuple_string<std::tuple<char,int,double,char_const*>,3ul> *)this,
             tuple_00);
  std::__cxx11::stringbuf::str();
  std::operator+(__return_storage_ptr__,&sStack_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }